

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O1

void CameraMoveToTarget(Camera *camera,float delta)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  uVar1 = (camera->position).x;
  uVar6 = (camera->position).y;
  uVar2 = (camera->target).x;
  uVar7 = (camera->target).y;
  fVar12 = (camera->target).z - (camera->position).z;
  fVar12 = fVar12 * fVar12 +
           ((float)uVar2 - (float)uVar1) * ((float)uVar2 - (float)uVar1) +
           ((float)uVar7 - (float)uVar6) * ((float)uVar7 - (float)uVar6);
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  uVar3 = (camera->position).x;
  uVar8 = (camera->position).y;
  uVar4 = (camera->target).x;
  uVar9 = (camera->target).y;
  fVar14 = (float)uVar4 - (float)uVar3;
  fVar15 = (float)uVar9 - (float)uVar8;
  fVar16 = (camera->target).z - (camera->position).z;
  fVar13 = fVar16 * fVar16 + fVar14 * fVar14 + fVar15 * fVar15;
  if (fVar13 < 0.0) {
    fVar13 = sqrtf(fVar13);
  }
  else {
    fVar13 = SQRT(fVar13);
  }
  if ((fVar13 != 0.0) || (NAN(fVar13))) {
    fVar13 = 1.0 / fVar13;
    fVar14 = fVar14 * fVar13;
    fVar15 = fVar15 * fVar13;
    fVar16 = fVar16 * fVar13;
  }
  fVar13 = -(fVar12 + delta);
  uVar11 = -(uint)(fVar13 < fVar12 + delta);
  fVar13 = (float)(~uVar11 & 0xba83126f | (uint)fVar13 & uVar11);
  uVar5 = (camera->target).x;
  uVar10 = (camera->target).y;
  fVar12 = (camera->target).z;
  (camera->position).x = fVar13 * fVar14 + (float)uVar5;
  (camera->position).y = (float)uVar10 + fVar15 * fVar13;
  (camera->position).z = fVar13 * fVar16 + fVar12;
  return;
}

Assistant:

void CameraMoveToTarget(Camera *camera, float delta)
{
    float distance = Vector3Distance(camera->position, camera->target);

    // Apply delta
    distance += delta;

    // Distance must be greater than 0
    if (distance <= 0) distance = 0.001f;

    // Set new distance by moving the position along the forward vector
    Vector3 forward = GetCameraForward(camera);
    camera->position = Vector3Add(camera->target, Vector3Scale(forward, -distance));
}